

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlinux.c
# Opt level: O2

PtError Pt_Stop(void)

{
  pt_callback_proc_id = pt_callback_proc_id + 1;
  if (pt_thread_created == '\x01') {
    pthread_join(pt_thread_pid,(void **)0x0);
    pt_thread_created = '\0';
  }
  time_started_flag = 0;
  return ptNoError;
}

Assistant:

PtError Pt_Stop()
{
    /* printf("Pt_Stop called\n"); */
    pt_callback_proc_id++;
    if (pt_thread_created) {
        pthread_join(pt_thread_pid, NULL);
        pt_thread_created = FALSE;
    }
    time_started_flag = FALSE;
    return ptNoError;
}